

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Aig_Man_t * Llb_ReachableStates(Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  DdManager *ddSource;
  int iVar1;
  uint numVars;
  int iVar2;
  abctime aVar3;
  Llb_Mnx_t *p_00;
  Vec_Int_t *p_01;
  Aig_Obj_t *pObj_00;
  DdManager *unique;
  int *Permute;
  DdNode *pDVar4;
  abctime aVar5;
  Abc_Ntk_t *pAVar6;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pAVar7;
  abctime clk;
  int RetValue;
  int i;
  Aig_Obj_t *pObj;
  Abc_Ntk_t *pNtkMuxes;
  Abc_Ntk_t *pNtk;
  Llb_Mnx_t *pMnn;
  DdNode *bReached;
  DdManager *dd;
  Gia_ParLlb_t *pPars;
  Gia_ParLlb_t Pars;
  Vec_Ptr_t *vNames;
  Vec_Int_t *vPermute;
  Aig_Man_t *pAig_local;
  
  aVar3 = Abc_Clock();
  Llb_ManSetDefaultParams((Gia_ParLlb_t *)&pPars);
  Pars.fSilent = 1;
  Pars.fIndConstr = 0;
  Pars.nPartValue = 0;
  Pars.fVerbose = 1;
  pPars._0_4_ = 100;
  Pars.nBddMax = 500;
  p_00 = Llb_MnxStart(pAig,(Gia_ParLlb_t *)&pPars);
  iVar1 = Llb_Nonlin4Reachability(p_00);
  if (iVar1 != 1) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                  ,0x468,"Aig_Man_t *Llb_ReachableStates(Aig_Man_t *)");
  }
  iVar1 = Cudd_ReadSize(p_00->dd);
  p_01 = Vec_IntStartFull(iVar1);
  for (clk._4_4_ = 0; iVar1 = Saig_ManRegNum(pAig), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    p = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p,clk._4_4_ + iVar1);
    iVar1 = Llb_ObjBddVar(p_00->vOrder,pObj_00);
    Vec_IntWriteEntry(p_01,iVar1,clk._4_4_);
  }
  numVars = Saig_ManRegNum(pAig);
  unique = Cudd_Init(numVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  ddSource = p_00->dd;
  pDVar4 = p_00->bReached;
  Permute = Vec_IntArray(p_01);
  pDVar4 = Extra_TransferPermute(ddSource,unique,pDVar4,Permute);
  Cudd_Ref(pDVar4);
  Vec_IntFree(p_01);
  iVar1 = Cudd_ReadSize(unique);
  iVar2 = Saig_ManRegNum(pAig);
  if (iVar1 != iVar2) {
    __assert_fail("Cudd_ReadSize(dd) == Saig_ManRegNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                  ,0x479,"Aig_Man_t *Llb_ReachableStates(Aig_Man_t *)");
  }
  aVar5 = Abc_Clock();
  p_00->timeTotal = aVar5 - aVar3;
  Llb_MnxStop(p_00);
  iVar1 = Saig_ManRegNum(pAig);
  Pars._104_8_ = Abc_NodeGetFakeNames(iVar1);
  pAVar6 = Abc_NtkDeriveFromBdd(unique,pDVar4,"reached",(Vec_Ptr_t *)Pars._104_8_);
  Abc_NodeFreeNames((Vec_Ptr_t *)Pars._104_8_);
  Cudd_RecursiveDeref(unique,pDVar4);
  Cudd_Quit(unique);
  pNtk_00 = Abc_NtkBddToMuxes(pAVar6,0,1000000);
  Abc_NtkDelete(pAVar6);
  pAVar6 = Abc_NtkStrash(pNtk_00,0,1,0);
  Abc_NtkDelete(pNtk_00);
  pAVar7 = Abc_NtkToDar(pAVar6,0,0);
  Abc_NtkDelete(pAVar6);
  return pAVar7;
}

Assistant:

Aig_Man_t * Llb_ReachableStates( Aig_Man_t * pAig )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Vec_Int_t * vPermute;
    Vec_Ptr_t * vNames;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    DdManager * dd;
    DdNode * bReached;
    Llb_Mnx_t * pMnn;
    Abc_Ntk_t * pNtk, * pNtkMuxes;
    Aig_Obj_t * pObj;
    int i, RetValue;
    abctime clk = Abc_Clock();

    // create parameters
    Llb_ManSetDefaultParams( pPars );
    pPars->fSkipOutCheck = 1;
    pPars->fCluster      = 0;
    pPars->fReorder      = 0;
    pPars->fSilent       = 1;
    pPars->nBddMax       = 100;
    pPars->nClusterMax   = 500;

    // run reachability
    pMnn = Llb_MnxStart( pAig, pPars );
    RetValue = Llb_Nonlin4Reachability( pMnn );
    assert( RetValue == 1 );

    // print BDD
//    Extra_bddPrint( pMnn->dd, pMnn->bReached ); 
//    Extra_bddPrintSupport( pMnn->dd, pMnn->bReached ); 
//    printf( "\n" );

    // collect flop output variables
    vPermute = Vec_IntStartFull( Cudd_ReadSize(pMnn->dd) );
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntWriteEntry( vPermute, Llb_ObjBddVar(pMnn->vOrder, pObj), i );

    // transfer the reached state BDD into the new manager
    dd = Cudd_Init( Saig_ManRegNum(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    bReached = Extra_TransferPermute( pMnn->dd, dd, pMnn->bReached, Vec_IntArray(vPermute) );  Cudd_Ref( bReached );
    Vec_IntFree( vPermute );
    assert( Cudd_ReadSize(dd) == Saig_ManRegNum(pAig) );

    // quit reachability engine
    pMnn->timeTotal = Abc_Clock() - clk;
    Llb_MnxStop( pMnn );

    // derive the network
    vNames = Abc_NodeGetFakeNames( Saig_ManRegNum(pAig) );
    pNtk = Abc_NtkDeriveFromBdd( dd, bReached, "reached", vNames );
    Abc_NodeFreeNames( vNames );
    Cudd_RecursiveDeref( dd, bReached );
    Cudd_Quit( dd );

    // convert
    pNtkMuxes = Abc_NtkBddToMuxes( pNtk, 0, 1000000 );
    Abc_NtkDelete( pNtk );
    pNtk = Abc_NtkStrash( pNtkMuxes, 0, 1, 0 );
    Abc_NtkDelete( pNtkMuxes );
    pAig = Abc_NtkToDar( pNtk, 0, 0 );
    Abc_NtkDelete( pNtk );
    return pAig;
}